

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::encode_array::shift(encode_array *this,size_t len)

{
  content *pcVar1;
  content *d;
  ulong uVar2;
  bool bVar3;
  content *__dest;
  ulong uVar4;
  
  uVar4 = (this->_state).done;
  if (len == 0) {
    uVar4 = uVar4 + (this->_state).scratch;
    pcVar1 = (this->_d)._buf._ref;
    if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)(pcVar1 + 0x18);
    }
    bVar3 = uVar4 < uVar2;
    if (uVar4 < uVar2) {
      if (pcVar1 == (content *)0x0) {
        __dest = (content *)0x0;
      }
      else {
        __dest = (content *)0x0;
        if (*(long *)(pcVar1 + 8) == 0) {
          __dest = pcVar1 + 0x20;
        }
      }
      memcpy(__dest,__dest + -uVar4,uVar4);
      array::set(&this->_d,uVar4,(void *)0x0);
    }
  }
  else if (uVar4 < len) {
    bVar3 = false;
  }
  else {
    (this->_state).done = uVar4 - len;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool encode_array::shift(size_t len)
{
	// move data segment to front
	if (!len) {
		size_t max, len = _state.done + _state.scratch;
		if ((max = _d.length() <= len)) {
			return false;
		}
		uint8_t *d = reinterpret_cast<uint8_t *>(_d.base());
		size_t shift = max - len;
		memcpy(d, d + shift, len);
		_d.set(len);
		return true;
	}
	// consume terminated data
	if (len > _state.done) {
		return false;
	}
	_state.done -= len;
	return true;
}